

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall inja::DataNode::DataNode(DataNode *this,string_view ptr_name,size_t pos)

{
  undefined **ppuVar1;
  string_view ptr_name_00;
  string local_60;
  allocator<char> local_29;
  size_t local_28;
  size_t pos_local;
  DataNode *this_local;
  string_view ptr_name_local;
  
  ptr_name_local._M_len = (size_t)ptr_name._M_str;
  this_local = (DataNode *)ptr_name._M_len;
  local_28 = pos;
  pos_local = (size_t)this;
  ExpressionNode::ExpressionNode(&this->super_ExpressionNode,pos);
  ppuVar1 = &PTR_accept_001c2c10;
  (this->super_ExpressionNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_001c2c10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_29);
  ::std::allocator<char>::~allocator(&local_29);
  ptr_name_00._M_str = (char *)ppuVar1;
  ptr_name_00._M_len = ptr_name_local._M_len;
  convert_dot_to_ptr_abi_cxx11_(&local_60,this_local,ptr_name_00);
  nlohmann::json_abi_v3_11_3::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  json_pointer(&this->ptr,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

explicit DataNode(std::string_view ptr_name, size_t pos): ExpressionNode(pos), name(ptr_name), ptr(json::json_pointer(convert_dot_to_ptr(ptr_name))) {}